

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O3

void __thiscall
reactor::event_demultiplexer(reactor *this,int *epollfd,epoll_event *events,int *ret,int *listenfd)

{
  uint uVar1;
  int fd;
  long lVar2;
  epoll_data_t *peVar3;
  
  if (0 < *ret) {
    peVar3 = &events->data;
    lVar2 = 0;
    do {
      uVar1 = ((epoll_event *)((long)peVar3 + -4))->events;
      fd = peVar3->fd;
      if (fd == *listenfd) {
        if ((uVar1 & 1) == 0) {
LAB_00104a41:
          if ((uVar1 & 4) != 0) {
            write_handle(this,epollfd,fd);
          }
        }
        else {
          listen_handle(this,epollfd,fd);
        }
      }
      else {
        if ((uVar1 & 1) == 0) goto LAB_00104a41;
        read_handle(this,epollfd,fd);
      }
      lVar2 = lVar2 + 1;
      peVar3 = (epoll_data_t *)((long)peVar3 + 0xc);
    } while (lVar2 < *ret);
  }
  return;
}

Assistant:

void reactor::event_demultiplexer(const int &epollfd,struct epoll_event *events,const int &ret,const int &listenfd){
    int i,fd;
    for(i=0;i<ret;i++){
        fd=events[i].data.fd;
        if((fd==listenfd)&&events[i].events&EPOLLIN)
            reactor::listen_handle(epollfd,fd);
        else if(events[i].events&EPOLLIN)
            reactor::read_handle(epollfd,fd);
        else if(events[i].events&EPOLLOUT)
            reactor::write_handle(epollfd,fd);
    }
}